

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate2<std::complex<double>_>::apply
          (QGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  complex<double> *pcVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  complex<double> *pcVar6;
  uint uVar7;
  long lVar8;
  undefined7 in_register_00000031;
  long lVar9;
  char *__assertion;
  int iVar10;
  long lVar11;
  long lVar12;
  SquareMatrix<std::complex<double>_> mat2;
  complex<double> x4;
  complex<double> x3;
  complex<double> x2;
  complex<double> x1;
  vector<int,_std::allocator<int>_> qubits;
  SquareMatrix<std::complex<double>_> local_158;
  SquareMatrix<std::complex<double>_> local_140;
  _Head_base<0UL,_std::complex<double>_*,_false> local_130;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> local_128;
  _Head_base<0UL,_std::complex<double>_*,_false> local_120;
  _Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> local_118;
  _Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> local_110;
  double local_108;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> local_100;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> local_f8;
  long local_f0;
  complex<double> local_e8;
  complex<double> local_d8;
  complex<double> local_c8;
  complex<double> local_b8;
  long local_a8;
  double local_a0;
  ulong local_98;
  complex<double> *local_90;
  long local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  long local_68;
  SquareMatrix<std::complex<double>_> *local_60;
  SquareMatrix<std::complex<double>_> local_58;
  int *local_48 [2];
  long local_38;
  
  local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl._0_4_ =
       (int)CONCAT71(in_register_00000031,side);
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[5])(local_48,this);
  iVar3 = *local_48[0] + offset;
  *local_48[0] = iVar3;
  iVar10 = offset + local_48[0][1];
  local_48[0][1] = iVar10;
  if (iVar3 < nbQubits) {
    if (iVar10 < nbQubits) {
      if (iVar3 + 1 != iVar10) {
        __assert_fail("qubits[0] + 1 == qubits[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                      ,0x29,
                      "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                     );
      }
      (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&local_140,this);
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&local_140);
      if ((char)local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl == 'L')
      {
        if (nbQubits == 2) {
          dense::SquareMatrix<std::complex<double>_>::operator*=(matrix,&local_140);
        }
        else {
          local_88 = CONCAT44(local_88._4_4_,~local_48[0][1] + nbQubits);
          if (0 < matrix->size_) {
            local_100._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                 (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                 (long)(1 << ((byte)(~local_48[0][1] + nbQubits) & 0x1f));
            local_a8 = CONCAT44(local_a8._4_4_,*local_48[0]);
            uVar7 = 1 << ((byte)*local_48[0] & 0x1f);
            local_90 = (complex<double> *)0x1;
            if (1 < (long)local_100._M_t.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl) {
              local_90 = (complex<double> *)
                         local_100._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
            }
            local_a0 = (double)((long)local_100._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl * 4);
            if ((int)uVar7 < 2) {
              uVar7 = 1;
            }
            local_98 = (ulong)uVar7;
            local_68 = (long)local_100._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl * 2;
            local_70 = (long)local_100._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl * 3;
            local_f0 = 0;
            local_60 = matrix;
            do {
              lVar9 = local_f0;
              if ((int)local_a8 != 0x1f) {
                lVar11 = 0;
                uVar5 = 0;
                do {
                  pcVar6 = local_90;
                  local_80 = uVar5;
                  local_78 = lVar11;
                  if ((int)local_88 != 0x1f) {
                    do {
                      puVar2 = (undefined1 *)
                               local_100._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      lVar12 = local_68 + lVar11;
                      lVar8 = local_70 + lVar11;
                      lVar4 = matrix->size_;
                      pcVar1 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_b8._M_value._0_8_ =
                           *(undefined8 *)pcVar1[lVar4 * lVar11 + lVar9]._M_value;
                      local_b8._M_value._8_8_ =
                           *(undefined8 *)(pcVar1[lVar4 * lVar11 + lVar9]._M_value + 8);
                      local_c8._M_value._0_8_ =
                           *(undefined8 *)pcVar1[lVar4 * (long)(puVar2 + lVar11) + lVar9]._M_value;
                      local_c8._M_value._8_8_ =
                           *(undefined8 *)
                            (pcVar1[lVar4 * (long)(puVar2 + lVar11) + lVar9]._M_value + 8);
                      local_d8._M_value._0_8_ =
                           *(undefined8 *)pcVar1[lVar4 * lVar12 + lVar9]._M_value;
                      local_d8._M_value._8_8_ =
                           *(undefined8 *)(pcVar1[lVar4 * lVar12 + lVar9]._M_value + 8);
                      local_e8._M_value._0_8_ =
                           *(undefined8 *)pcVar1[lVar4 * lVar8 + lVar9]._M_value;
                      local_e8._M_value._8_8_ =
                           *(undefined8 *)(pcVar1[lVar4 * lVar8 + lVar9]._M_value + 8);
                      local_158.size_ =
                           *(size_type_conflict *)
                            local_140.data_._M_t.
                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)local_140.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 8))->_M_t;
                      local_f8._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              )pcVar6;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                      local_108 = (double)local_158.size_;
                      local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x10))->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                      local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)local_158.size_;
                      local_120._M_head_impl =
                           (complex<double> *)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)local_140.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x28))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                      local_130._M_head_impl = (complex<double> *)local_158.size_;
                      local_128._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              )local_158.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x30))->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)local_140.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x38))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                      lVar4 = local_60->size_ * lVar11;
                      pcVar6 = (local_60->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      *(double *)pcVar6[lVar4 + lVar9]._M_value =
                           local_108 +
                           (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_130._M_head_impl +
                           (double)local_158.size_;
                      *(double *)(pcVar6[lVar4 + lVar9]._M_value + 8) =
                           (double)local_110.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_120._M_head_impl +
                           (double)local_128._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl +
                           (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      pcVar6 = (complex<double> *)
                               ((long)local_140.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_140.size_ * 0x10);
                      local_158.size_ = *(size_type_conflict *)pcVar6->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)pcVar6->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                      local_108 = (double)local_158.size_;
                      local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_140.size_ + 1) * 0x10))->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_140.size_ + 1) * 0x10))->
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                      local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)local_158.size_;
                      local_120._M_head_impl =
                           (complex<double> *)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))[local_140.size_]._M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x20))[local_140.size_]._M_value +
                                    8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                      local_128._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              )local_158.size_;
                      local_130._M_head_impl =
                           (complex<double> *)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_140.size_ + 3) * 0x10))->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_140.size_ + 3) * 0x10))->
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                      lVar4 = (long)(puVar2 + lVar11) * local_60->size_;
                      pcVar6 = (local_60->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      *(double *)pcVar6[lVar4 + lVar9]._M_value =
                           local_108 +
                           (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl +
                           (double)local_128._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_158.size_;
                      *(double *)(pcVar6[lVar4 + lVar9]._M_value + 8) =
                           (double)local_110.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_120._M_head_impl +
                           (double)local_130._M_head_impl +
                           (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      pcVar6 = (complex<double> *)
                               ((long)local_140.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_140.size_ * 0x20);
                      local_158.size_ = *(size_type_conflict *)pcVar6->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)pcVar6->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                      local_108 = (double)local_158.size_;
                      local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x10))[local_140.size_ * 2]._M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))[local_140.size_ * 2].
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                      local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)local_158.size_;
                      local_120._M_head_impl =
                           (complex<double> *)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))[local_140.size_ * 2]._M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x20))[local_140.size_ * 2].
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                      local_128._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              )local_158.size_;
                      local_130._M_head_impl =
                           (complex<double> *)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_140.size_ * 2 + 3) * 0x10))->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_140.size_ * 2 + 3) * 0x10))
                                           ->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                      matrix = local_60;
                      lVar12 = lVar12 * local_60->size_;
                      pcVar6 = (local_60->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      *(double *)pcVar6[lVar12 + lVar9]._M_value =
                           local_108 +
                           (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl +
                           (double)local_128._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_158.size_;
                      *(double *)(pcVar6[lVar12 + lVar9]._M_value + 8) =
                           (double)local_110.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_120._M_head_impl +
                           (double)local_130._M_head_impl +
                           (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      pcVar6 = (complex<double> *)
                               ((long)local_140.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_140.size_ * 0x30);
                      local_158.size_ = *(size_type_conflict *)pcVar6->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)pcVar6->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                      local_108 = (double)local_158.size_;
                      local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_140.size_ * 3 + 1) * 0x10))->_M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_140.size_ * 3 + 1) * 0x10))
                                           ->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                      local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)local_158.size_;
                      local_120._M_head_impl =
                           (complex<double> *)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))[local_140.size_ * 3]._M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_140.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x20))[local_140.size_ * 3].
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                      local_128._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              )local_158.size_;
                      local_130._M_head_impl =
                           (complex<double> *)
                           local_158.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_158.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_140.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x30))[local_140.size_ * 3]._M_value;
                      local_158.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                            )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                             ((long)((complex<double> *)
                                    ((long)local_140.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x30))[local_140.size_ * 3]._M_value + 8))
                             ->_M_head_impl;
                      std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                      lVar8 = lVar8 * matrix->size_;
                      pcVar6 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      *(double *)pcVar6[lVar8 + lVar9]._M_value =
                           local_108 +
                           (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl +
                           (double)local_128._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_158.size_;
                      *(double *)(pcVar6[lVar8 + lVar9]._M_value + 8) =
                           (double)local_110.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_120._M_head_impl +
                           (double)local_130._M_head_impl +
                           (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      lVar11 = lVar11 + 1;
                      pcVar6 = (complex<double> *)
                               (((complex<double> *)
                                ((long)local_f8._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + -0x10))->_M_value + 0xf);
                    } while (pcVar6 != (complex<double> *)0x0);
                  }
                  uVar5 = local_80 + 1;
                  lVar11 = local_78 + (long)local_a0;
                } while (uVar5 != local_98);
              }
              local_f0 = local_f0 + 1;
            } while (local_f0 < matrix->size_);
          }
        }
      }
      else if (nbQubits == 2) {
        dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_58,&local_140);
        dense::SquareMatrix<std::complex<double>_>::operator*=(&local_58,matrix);
        dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_158,&local_58);
        dense::SquareMatrix<std::complex<double>_>::operator=(matrix,&local_158);
        if ((_Head_base<0UL,_std::complex<double>_*,_false>)
            local_158.data_._M_t.
            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
            (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
          operator_delete__((void *)local_158.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl);
        }
        local_158.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
               0x0;
        if (local_58.data_._M_t.
            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0
           ) {
          operator_delete__((void *)local_58.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl);
        }
        local_58.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
               0x0;
      }
      else {
        local_78 = CONCAT44(local_78._4_4_,~local_48[0][1] + nbQubits);
        if (0 < matrix->size_) {
          lVar9 = (long)(1 << ((byte)(~local_48[0][1] + nbQubits) & 0x1f));
          local_98 = CONCAT44(local_98._4_4_,*local_48[0]);
          uVar7 = 1 << ((byte)*local_48[0] & 0x1f);
          local_68 = 1;
          if (1 < lVar9) {
            local_68 = lVar9;
          }
          local_80 = (ulong)uVar7;
          if ((int)uVar7 < 2) {
            local_80 = 1;
          }
          local_68 = local_68 << 4;
          local_f0 = lVar9 * 0x10;
          local_a8 = lVar9 * 0x30;
          local_88 = lVar9 << 6;
          local_a0 = (double)(lVar9 << 5);
          lVar9 = 0;
          pcVar6 = (complex<double> *)0x0;
          do {
            local_90 = pcVar6;
            if ((int)local_98 != 0x1f) {
              local_108 = local_a0;
              local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                   (_Head_base<0UL,_std::complex<double>_*,_false>)(complex<double> *)0x0;
              uVar5 = 0;
              lVar11 = local_a8;
              lVar12 = local_f0;
              do {
                local_70 = uVar5;
                if ((int)local_78 != 0x1f) {
                  lVar8 = 0;
                  do {
                    lVar4 = matrix->size_ * lVar9;
                    pcVar6 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_b8._M_value._0_8_ =
                         *(undefined8 *)
                          ((undefined *)
                           local_110.super__Head_base<0UL,_std::complex<double>_*,_false>.
                           _M_head_impl + (long)(pcVar6->_M_value + lVar8 + lVar4));
                    local_b8._M_value._8_8_ =
                         *(undefined8 *)
                          ((long)((undefined *)
                                  local_110.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                  _M_head_impl + (long)(pcVar6->_M_value + lVar8 + lVar4)) + 8);
                    local_c8._M_value._0_8_ =
                         *(undefined8 *)(pcVar6->_M_value + lVar8 + lVar12 + lVar4);
                    local_c8._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar6->_M_value + lVar8 + lVar12 + lVar4) + 8);
                    local_d8._M_value._0_8_ =
                         *(undefined8 *)(pcVar6->_M_value + lVar8 + (long)local_108 + lVar4);
                    local_d8._M_value._8_8_ =
                         *(undefined8 *)
                          ((long)(pcVar6->_M_value + lVar8 + (long)local_108 + lVar4) + 8);
                    local_e8._M_value._0_8_ =
                         *(undefined8 *)(pcVar6->_M_value + lVar8 + lVar11 + lVar4);
                    local_e8._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar6->_M_value + lVar8 + lVar11 + lVar4) + 8);
                    local_158.size_ =
                         *(size_type_conflict *)
                          local_140.data_._M_t.
                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_140.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                    local_120._M_head_impl = (complex<double> *)local_158.size_;
                    local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + local_140.size_ * 0x10))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + local_140.size_ * 0x10))->_M_value +
                                  8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                    local_128._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_130._M_head_impl =
                         (complex<double> *)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    pcVar6 = (complex<double> *)
                             ((long)local_140.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl + local_140.size_ * 0x20);
                    local_158.size_ = *(size_type_conflict *)pcVar6->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)pcVar6->_M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                    local_f8._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    pcVar6 = (complex<double> *)
                             ((long)local_140.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl + local_140.size_ * 0x30);
                    local_158.size_ = *(size_type_conflict *)pcVar6->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)pcVar6->_M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                    lVar4 = matrix->size_ * lVar9;
                    pcVar6 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    *(double *)
                     ((undefined *)
                      local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                     (long)(pcVar6->_M_value + lVar8 + lVar4)) =
                         (double)local_120._M_head_impl +
                         (double)local_128._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_f8._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_158.size_;
                    *(double *)
                     ((undefined *)
                      local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                     (long)(pcVar6->_M_value + lVar8 + 8 + lVar4)) =
                         (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                 _M_head_impl + (double)local_130._M_head_impl +
                         (double)local_100._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x10))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_140.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x18))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                    local_120._M_head_impl = (complex<double> *)local_158.size_;
                    local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_140.size_ + 1) * 0x10))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_140.size_ + 1) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                    local_128._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_130._M_head_impl =
                         (complex<double> *)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x10))[local_140.size_ * 2]._M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x10))[local_140.size_ * 2]._M_value
                                  + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                    local_f8._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_140.size_ * 3 + 1) * 0x10))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_140.size_ * 3 + 1) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                    pcVar6 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    lVar4 = lVar12 + matrix->size_ * lVar9;
                    *(double *)(pcVar6->_M_value + lVar8 + lVar4) =
                         (double)local_120._M_head_impl +
                         (double)local_128._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_f8._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_158.size_;
                    *(double *)(pcVar6->_M_value + lVar8 + 8 + lVar4) =
                         (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                 _M_head_impl + (double)local_130._M_head_impl +
                         (double)local_100._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x20))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_140.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x28))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                    local_120._M_head_impl = (complex<double> *)local_158.size_;
                    local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x20))[local_140.size_]._M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x20))[local_140.size_]._M_value + 8
                                  ))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                    local_128._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_130._M_head_impl =
                         (complex<double> *)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x20))[local_140.size_ * 2]._M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x20))[local_140.size_ * 2]._M_value
                                  + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                    local_f8._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_140.size_ * 3 + 2) * 0x10))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_140.size_ * 3 + 2) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                    pcVar6 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    lVar4 = (long)local_108 + matrix->size_ * lVar9;
                    *(double *)(pcVar6->_M_value + lVar8 + lVar4) =
                         (double)local_120._M_head_impl +
                         (double)local_128._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_f8._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_158.size_;
                    *(double *)(pcVar6->_M_value + lVar8 + 8 + lVar4) =
                         (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                 _M_head_impl + (double)local_130._M_head_impl +
                         (double)local_100._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x30))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_140.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x38))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_b8);
                    local_120._M_head_impl = (complex<double> *)local_158.size_;
                    local_118.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         (_Head_base<0UL,_std::complex<double>_*,_false>)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_140.size_ + 3) * 0x10))->_M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_140.size_ + 3) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_c8);
                    local_128._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_130._M_head_impl =
                         (complex<double> *)
                         local_158.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x30))[local_140.size_ * 2]._M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_140.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x30))[local_140.size_ * 2]._M_value
                                  + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_d8);
                    local_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.size_;
                    local_f8._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_158.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_158.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_140.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x30))[local_140.size_ * 3]._M_value;
                    local_158.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                          )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                           ((long)((complex<double> *)
                                  ((long)local_140.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x30))[local_140.size_ * 3]._M_value + 8))->
                           _M_head_impl;
                    std::complex<double>::operator*=((complex<double> *)&local_158,&local_e8);
                    pcVar6 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    lVar4 = lVar11 + matrix->size_ * lVar9;
                    *(double *)(pcVar6->_M_value + lVar8 + lVar4) =
                         (double)local_120._M_head_impl +
                         (double)local_128._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_100._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (double)local_158.size_;
                    *(double *)(pcVar6->_M_value + lVar8 + 8 + lVar4) =
                         (double)local_118.super__Head_base<0UL,_std::complex<double>_*,_false>.
                                 _M_head_impl + (double)local_130._M_head_impl +
                         (double)local_f8._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         + (double)local_158.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                    lVar8 = lVar8 + 0x10;
                  } while (local_68 != lVar8);
                }
                uVar5 = local_70 + 1;
                lVar11 = lVar11 + local_88;
                local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     (_Head_base<0UL,_std::complex<double>_*,_false>)
                     ((undefined *)
                      local_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                     local_88);
                lVar12 = lVar12 + local_88;
                local_108 = (double)((long)local_108 + local_88);
              } while (uVar5 != local_80);
            }
            pcVar6 = (complex<double> *)(local_90->_M_value + 1);
            lVar9 = lVar9 + 0x10;
          } while ((long)pcVar6 < matrix->size_);
        }
      }
      if (local_140.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0)
      {
        operator_delete__((void *)local_140.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         );
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,0x28,
                "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }